

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O3

void ga_c2fstring(char *cstring,char *fstring,int flength)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  sVar3 = strlen(cstring);
  iVar1 = (int)sVar3;
  uVar2 = iVar1 - (uint)(cstring[iVar1] == '\n');
  uVar5 = flength;
  if ((int)uVar2 < flength) {
    uVar5 = uVar2;
  }
  if (uVar5 != 0) {
    lVar4 = (long)iVar1 - (ulong)(cstring[iVar1] == '\n');
    if (flength <= lVar4) {
      lVar4 = (long)flength;
    }
    lVar6 = 0;
    do {
      fstring[lVar6] = cstring[lVar6];
      lVar6 = lVar6 + 1;
    } while ((int)lVar4 != (int)lVar6);
    fstring = fstring + lVar6;
  }
  if ((int)uVar2 < flength) {
    memset(fstring,0x20,(ulong)(~uVar5 + flength) + 1);
    return;
  }
  return;
}

Assistant:

void ga_c2fstring(char *cstring, char *fstring, int flength)
{
    int clength = strlen(cstring);

    /* remove terminal \n character if any */
    if(cstring[clength] == '\n') {
        clength--;
    }

    /* Truncate C string into Fortran string */
    if (clength > flength) {
        clength = (int)flength;
    }

    /* Copy characters over */
    flength -= clength;
    while (clength--) {
        *fstring++ = *cstring++;
    }

    /* Now terminate with blanks */
    while (flength--) {
        *fstring++ = ' ';
    }
}